

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Logger.cpp
# Opt level: O0

void __thiscall
Logger::StructuredFileOutputSink::gotMessage
          (StructuredFileOutputSink *this,char *message,uint flags)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  time_t tVar4;
  char *__filename;
  uint local_84;
  undefined2 local_80;
  undefined2 local_7e;
  int flags_1;
  flock fl;
  FILE *newFile;
  FastString fileName;
  ScopedLockT<Threading::FastLock> local_38;
  ScopedLock scope;
  uint32 uStack_28;
  uint32 nowTime;
  time_t now;
  uint flags_local;
  char *message_local;
  StructuredFileOutputSink *this_local;
  
  uVar2 = (**(this->super_OutputSink)._vptr_OutputSink)(this,(ulong)flags);
  if (((uVar2 & 1) != 0) && (this->file != (FILE *)0x0)) {
    tVar4 = time((time_t *)0x0);
    uStack_28 = (uint32)tVar4;
    scope.lock._4_4_ = uStack_28;
    Threading::ScopedLockT<Threading::FastLock>::ScopedLockT(&local_38,&this->lock);
    bVar1 = Bstrlib::String::operator==(&this->lastMessage,message);
    if ((bVar1) && (this->lastFlags == flags)) {
      this->lastMessageCount = this->lastMessageCount + 1;
      fileName.super_tagbstring.data._0_4_ = 1;
    }
    else {
      flushLastMessage(this);
      iVar3 = Bstrlib::String::getLength(&this->lastMessage);
      this->currentSize = iVar3 + this->currentSize;
      if (this->breakSize <= this->currentSize) {
        Bstrlib::String::operator+((String *)&newFile,(char *)&this->baseFileName);
        __filename = Bstrlib::String::operator_cast_to_char_((String *)&newFile);
        fl._24_8_ = fopen(__filename,"wb");
        if ((FILE *)fl._24_8_ != (FILE *)0x0) {
          local_7e = 0;
          fl.l_type = 0;
          fl.l_whence = 0;
          fl._4_4_ = 0;
          fl.l_start = 0;
          local_80 = 1;
          iVar3 = fileno((FILE *)fl._24_8_);
          fcntl(iVar3,6,&local_80);
          iVar3 = fileno((FILE *)fl._24_8_);
          local_84 = fcntl(iVar3,1);
          local_84 = local_84 | 1;
          iVar3 = fileno((FILE *)fl._24_8_);
          fcntl(iVar3,2,(ulong)local_84);
          fclose((FILE *)this->file);
          this->file = (FILE *)fl._24_8_;
        }
        this->flipFlop = (bool)((this->flipFlop ^ 0xffU) & 1);
        this->currentSize = 0;
        Bstrlib::String::~String((String *)&newFile);
      }
      Bstrlib::String::operator=(&this->lastMessage,message);
      this->lastFlags = flags;
      this->lastMessageCount = 1;
      this->lastTime = scope.lock._4_4_;
      fileName.super_tagbstring.data._0_4_ = 0;
    }
    Threading::ScopedLockT<Threading::FastLock>::~ScopedLockT(&local_38);
  }
  return;
}

Assistant:

void StructuredFileOutputSink::gotMessage(const char * message, const unsigned int flags)
    {
        if (!checkFlags(flags) || file == 0) return;
        // Need to structure the file
        // Find out the time
        time_t now = time(NULL);
        // Don't allow 64 bits time
        uint32 nowTime = (uint32)now;

        Threading::ScopedLock scope(lock);
        if (lastMessage == message && lastFlags == flags)
        {
            lastMessageCount++;
            return;
        }
        flushLastMessage();

        // Split the log file if required
        currentSize += lastMessage.getLength();
        if (currentSize >= breakSize)
        {
            Strings::FastString fileName = baseFileName + (flipFlop ? ".1" : ".0");
#ifdef _WIN32
            FILE * newFile = _fsopen(fileName, "wb", _SH_DENYWR);
#elif defined(_POSIX)
            FILE * newFile = fopen(fileName, "wb");
            if (newFile)
            {
                struct flock fl;
                fl.l_whence = SEEK_SET;
                fl.l_start = 0; fl.l_len = 0; fl.l_type = F_WRLCK;
                fcntl(fileno(newFile), F_SETLK, &fl);

                // Prevent any child process from inheriting the file on forking
                int flags = fcntl(fileno(newFile), F_GETFD);
                flags |= FD_CLOEXEC;
                fcntl(fileno(newFile), F_SETFD, flags);
                fclose(file);
                file = newFile;
            }
#endif
            flipFlop = !flipFlop;
            currentSize = 0;
        }
        lastMessage = message;
        lastFlags = flags;
        lastMessageCount = 1;
        lastTime = nowTime;
    }